

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error ft_stroker_process_corner(PVG_FT_Stroker stroker,PVG_FT_Fixed line_length)

{
  PVG_FT_Angle PVar1;
  uint local_2c;
  PVG_FT_Int inside_side;
  PVG_FT_Angle turn;
  PVG_FT_Error error;
  PVG_FT_Fixed line_length_local;
  PVG_FT_Stroker stroker_local;
  
  turn._4_4_ = 0;
  PVar1 = PVG_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
  if (PVar1 != 0) {
    local_2c = (uint)(PVar1 < 0);
    turn._4_4_ = ft_stroker_inside(stroker,local_2c,line_length);
    if (turn._4_4_ == 0) {
      turn._4_4_ = ft_stroker_outside(stroker,1 - local_2c,line_length);
    }
  }
  return turn._4_4_;
}

Assistant:

static PVG_FT_Error ft_stroker_process_corner(PVG_FT_Stroker stroker,
                                             PVG_FT_Fixed   line_length)
{
    PVG_FT_Error error = 0;
    PVG_FT_Angle turn;
    PVG_FT_Int   inside_side;

    turn = PVG_FT_Angle_Diff(stroker->angle_in, stroker->angle_out);

    /* no specific corner processing is required if the turn is 0 */
    if (turn == 0) goto Exit;

    /* when we turn to the right, the inside side is 0 */
    inside_side = 0;

    /* otherwise, the inside side is 1 */
    if (turn < 0) inside_side = 1;

    /* process the inside side */
    error = ft_stroker_inside(stroker, inside_side, line_length);
    if (error) goto Exit;

    /* process the outside side */
    error = ft_stroker_outside(stroker, 1 - inside_side, line_length);

Exit:
    return error;
}